

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O3

void __thiscall PrettyPrinter::visit(PrettyPrinter *this,BlockStmt *node)

{
  pointer puVar1;
  Stmt *pSVar2;
  unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_> *statement;
  pointer puVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  puVar1 = (node->m_statements).
           super__Vector_base<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (node->m_statements).
                super__Vector_base<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
    pSVar2 = (puVar3->_M_t).super___uniq_ptr_impl<AST::Stmt,_std::default_delete<AST::Stmt>_>._M_t.
             super__Tuple_impl<0UL,_AST::Stmt_*,_std::default_delete<AST::Stmt>_>.
             super__Head_base<0UL,_AST::Stmt_*,_false>._M_head_impl;
    (*pSVar2->_vptr_Stmt[2])(pSVar2,this);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"};",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

void PrettyPrinter::visit(AST::BlockStmt *node) {
    std::cout << "{" << std::endl;
    for (auto& statement : node->m_statements) {
        std::cout << "    ";
        statement->accept(this);
    }
    std::cout << "};" << std::endl;
}